

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::AtomicCmpxchg::finalize(AtomicCmpxchg *this)

{
  bool bVar1;
  bool local_29;
  Type local_28;
  BasicType local_1c [3];
  AtomicCmpxchg *local_10;
  AtomicCmpxchg *this_local;
  
  local_1c[2] = 1;
  local_10 = this;
  bVar1 = wasm::Type::operator==(&this->ptr->type,local_1c + 2);
  local_29 = true;
  if (!bVar1) {
    local_1c[1] = 1;
    bVar1 = wasm::Type::operator==(&this->expected->type,local_1c + 1);
    local_29 = true;
    if (!bVar1) {
      local_1c[0] = unreachable;
      local_29 = wasm::Type::operator==(&this->replacement->type,local_1c);
    }
  }
  if (local_29 != false) {
    wasm::Type::Type(&local_28,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id =
         local_28.id;
  }
  return;
}

Assistant:

void AtomicCmpxchg::finalize() {
  if (ptr->type == Type::unreachable || expected->type == Type::unreachable ||
      replacement->type == Type::unreachable) {
    type = Type::unreachable;
  }
}